

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockExpectedCallTest.cpp
# Opt level: O0

void __thiscall
TEST_MockExpectedCall_hasOutputParameter_Test::testBody
          (TEST_MockExpectedCall_hasOutputParameter_Test *this)

{
  MockCheckedExpectedCall *pMVar1;
  uint uVar2;
  UtestShell *pUVar3;
  TestTerminator *pTVar4;
  SimpleString local_98;
  undefined1 local_88 [8];
  MockNamedValue foo;
  SimpleString local_28;
  undefined4 local_14;
  TEST_MockExpectedCall_hasOutputParameter_Test *pTStack_10;
  int value;
  TEST_MockExpectedCall_hasOutputParameter_Test *this_local;
  
  local_14 = 1;
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMockExpectedCall).call;
  pTStack_10 = this;
  SimpleString::SimpleString(&local_28,"foo");
  (*(pMVar1->super_MockExpectedCall)._vptr_MockExpectedCall[6])(pMVar1,&local_28,&local_14,4);
  SimpleString::~SimpleString(&local_28);
  SimpleString::SimpleString(&local_98,"foo");
  MockNamedValue::MockNamedValue((MockNamedValue *)local_88,&local_98);
  SimpleString::~SimpleString(&local_98);
  MockNamedValue::setValue((MockNamedValue *)local_88,&local_14);
  pUVar3 = UtestShell::getCurrent();
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMockExpectedCall).call;
  uVar2 = (*(pMVar1->super_MockExpectedCall)._vptr_MockExpectedCall[0x2d])(pMVar1,local_88);
  pTVar4 = UtestShell::getCurrentTestTerminator();
  (*pUVar3->_vptr_UtestShell[8])
            (pUVar3,(ulong)(uVar2 & 1),"CHECK","call->hasOutputParameter(foo)",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockExpectedCallTest.cpp"
             ,0x2d0,pTVar4);
  MockNamedValue::~MockNamedValue((MockNamedValue *)local_88);
  return;
}

Assistant:

TEST(MockExpectedCall, hasOutputParameter)
{
    const int value = 1;
    call->withOutputParameterReturning("foo", &value, sizeof(value));
    MockNamedValue foo("foo");
    foo.setValue(&value);
    CHECK(call->hasOutputParameter(foo));
}